

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::clauseComparator(SelectionCompiler *this)

{
  any *this_00;
  bool bVar1;
  int iVar2;
  type_info *ptVar3;
  any floatVal;
  Token tokenValue;
  Token tokenComparator;
  Token tokenAtomProperty;
  any local_88;
  float local_74;
  Token local_70;
  Token local_58;
  Token local_40;
  value_type local_28;
  
  tokenNext(&local_40,this);
  tokenNext(&local_58,this);
  if ((local_58.tok & 0x2400U) == 0) {
    bVar1 = comparisonOperatorExpected(this);
    goto LAB_001c6420;
  }
  tokenNext(&local_70,this);
  if (local_70.tok - 4U < 0xfffffffe) {
    bVar1 = numberExpected(this);
  }
  else {
    this_00 = &local_70.value;
    ptVar3 = std::any::type(this_00);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&int::typeinfo);
    if (bVar1) {
      iVar2 = std::any_cast<int>(this_00);
      local_74 = (float)iVar2;
    }
    else {
      ptVar3 = std::any::type(this_00);
      bVar1 = std::type_info::operator==(ptVar3,(type_info *)&float::typeinfo);
      if (!bVar1) {
        bVar1 = false;
        goto LAB_001c6416;
      }
      local_74 = std::any_cast<float>(this_00);
    }
    local_88._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    local_88._M_storage._M_ptr = (void *)0x0;
    std::any::operator=(&local_88,&local_74);
    local_28.tok = local_58.tok;
    local_28.intValue = local_40.tok;
    std::any::any(&local_28.value,&local_88);
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
              (&this->ltokenPostfix,&local_28);
    std::any::reset(&local_28.value);
    std::any::reset(&local_88);
    bVar1 = true;
  }
LAB_001c6416:
  std::any::reset(&local_70.value);
LAB_001c6420:
  std::any::reset(&local_58.value);
  std::any::reset(&local_40.value);
  return bVar1;
}

Assistant:

bool SelectionCompiler::clauseComparator() {
    Token tokenAtomProperty = tokenNext();
    Token tokenComparator   = tokenNext();
    if ((tokenComparator.tok & Token::comparator) == 0) {
      return comparisonOperatorExpected();
    }

    Token tokenValue = tokenNext();
    if (tokenValue.tok != Token::integer && tokenValue.tok != Token::decimal) {
      return numberExpected();
    }

    float val;
    if (tokenValue.value.type() == typeid(int)) {
      val = std::any_cast<int>(tokenValue.value);
    } else if (tokenValue.value.type() == typeid(float)) {
      val = std::any_cast<float>(tokenValue.value);
    } else {
      return false;
    }

    std::any floatVal;
    floatVal = val;
    return addTokenToPostfix(
        Token(tokenComparator.tok, tokenAtomProperty.tok, floatVal));
  }